

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_NAPwait(NAPComm *nap_comm,NAPData *nap_data)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  char *unpacked_buf;
  int local_R_tag;
  MPI_Datatype recv_type;
  MPI_Datatype send_type;
  MPI_Request *L_recv_requests;
  MPI_Request *L_send_requests;
  MPI_Request *recv_requests;
  MPI_Request *send_requests;
  char *global_recv_buffer;
  char *global_send_buffer;
  char *local_L_recv_data;
  char *local_R_recv_data;
  MPI_Comm mpi_comm;
  NAPCommData *nap_recv_data;
  NAPCommData *nap_send_data;
  MPI_Request *in_stack_ffffffffffffff30;
  MPI_Request *in_stack_ffffffffffffff38;
  NAPCommData *in_stack_ffffffffffffff40;
  MPI_Datatype in_stack_ffffffffffffff48;
  undefined8 *puVar2;
  MPI_Comm in_stack_ffffffffffffff50;
  void *pvVar3;
  MPI_Datatype in_stack_ffffffffffffff58;
  int size;
  char **in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *pcVar4;
  comm_pkg *in_stack_ffffffffffffff70;
  char *local_88;
  undefined4 in_stack_ffffffffffffff80;
  MPI_Request *send_requests_00;
  MPI_Request *recv_requests_00;
  
  pvVar3 = (void *)*in_RSI;
  puVar2 = (undefined8 *)in_RSI[1];
  recv_requests_00 = *(MPI_Request **)((long)pvVar3 + 0x18);
  send_requests_00 = (MPI_Request *)puVar2[3];
  iVar1 = *(int *)(puVar2 + 4) + 2;
  MPIX_step_waitall((comm_pkg *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff30);
  MPIX_step_waitall((comm_pkg *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff30);
  if (*(long *)((long)pvVar3 + 0x10) != 0) {
    in_stack_ffffffffffffff70 = *(comm_pkg **)((long)pvVar3 + 0x10);
    if (in_stack_ffffffffffffff70 != (comm_pkg *)0x0) {
      operator_delete__(in_stack_ffffffffffffff70);
    }
    *(undefined8 *)((long)pvVar3 + 0x10) = 0;
  }
  pcVar4 = (char *)puVar2[2];
  if (pcVar4 != (char *)0x0) {
    MPIX_intra_recv_map(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50);
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
    puVar2[2] = 0;
    in_stack_ffffffffffffff68 = pcVar4;
  }
  size = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_88 = (char *)0x0;
  if (*(int *)(*(long *)(*(long *)(in_RDI + 0x18) + 8) + 4) != 0) {
    local_88 = MPIX_NAP_unpack((char *)in_stack_ffffffffffffff60,size,
                               (MPI_Datatype)in_stack_ffffffffffffff50,
                               (MPI_Comm)in_stack_ffffffffffffff48);
  }
  MPIX_step_comm(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,size,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (MPI_Datatype)CONCAT44(iVar1,in_stack_ffffffffffffff80),send_requests_00,
                 recv_requests_00);
  if ((local_88 != (char *)0x0) && (local_88 != (char *)0x0)) {
    operator_delete__(local_88);
  }
  *puVar2 = 0;
  if (pvVar3 != (void *)0x0) {
    NAPCommData::~NAPCommData(in_stack_ffffffffffffff40);
    operator_delete(pvVar3);
  }
  if (puVar2 != (undefined8 *)0x0) {
    NAPCommData::~NAPCommData(in_stack_ffffffffffffff40);
    operator_delete(puVar2);
  }
  return;
}

Assistant:

static void MPIX_NAPwait(NAPComm* nap_comm, NAPData* nap_data)
{
    NAPCommData* nap_send_data = nap_data->send_data;
    NAPCommData* nap_recv_data = nap_data->recv_data;
    MPI_Comm mpi_comm = nap_data->mpi_comm;

    char* local_R_recv_data = NULL;
    char* local_L_recv_data = nap_recv_data->local_L_buffer;
    char* global_send_buffer = nap_send_data->global_buffer;
    char* global_recv_buffer = nap_recv_data->global_buffer;
    MPI_Request* send_requests = nap_comm->send_requests;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_send_requests = NULL;
    MPI_Request* L_recv_requests = NULL;
    MPI_Datatype send_type = nap_send_data->datatype;
    MPI_Datatype recv_type = nap_recv_data->datatype;

    int local_R_tag = nap_recv_data->tag + 2;

    MPIX_step_waitall(nap_comm->global_comm, send_requests, recv_requests);
    if (nap_comm->local_L_comm->send_data->num_msgs)
        L_send_requests = &(send_requests[nap_comm->global_comm->send_data->num_msgs]);
    if (nap_comm->local_L_comm->recv_data->num_msgs)
        L_recv_requests = &(recv_requests[nap_comm->global_comm->recv_data->num_msgs]);
    MPIX_step_waitall(nap_comm->local_L_comm, L_send_requests, L_recv_requests);
    if (nap_send_data->local_L_buffer)
    {
        delete[] nap_send_data->local_L_buffer;
        nap_send_data->local_L_buffer = NULL;
    }

    // Map recv buffers from final intra node steps to correct locations in
    // recv_data
    local_L_recv_data = nap_recv_data->local_L_buffer;
    if (local_L_recv_data)
    {
        MPIX_intra_recv_map(nap_comm->local_L_comm, local_L_recv_data, nap_recv_data->buf,
                recv_type, nap_comm->topo_info->local_comm);
        delete[] local_L_recv_data;
        nap_recv_data->local_L_buffer = NULL;
    }

    // Final intra-node redistribution (step 3 in nap comm)
    // Unpack global_recv_buffer ot U[] (but don't know U here...)
    char* unpacked_buf = NULL;
    if (nap_comm->global_comm->recv_data->size_msgs)
    {
        // Unpack previous recv into void*
        unpacked_buf = MPIX_NAP_unpack(global_recv_buffer, 
                nap_comm->global_comm->recv_data->size_msgs,
                recv_type, mpi_comm);
    }

    // Initialize Isends for inter-node step (step 2 in nap comm)
    MPIX_step_comm(nap_comm->local_R_comm, global_recv_buffer, &local_R_recv_data,
            local_R_tag, nap_comm->topo_info->local_comm, recv_type, recv_type,
            send_requests, recv_requests);

    if (unpacked_buf)
        delete[] unpacked_buf;
    
    if (local_R_recv_data)
    {
        MPIX_intra_recv_map(nap_comm->local_R_comm, local_R_recv_data, nap_recv_data->buf,
                recv_type, nap_comm->topo_info->local_comm);
        delete[] local_R_recv_data;
    }
    nap_recv_data->buf = NULL;
    delete nap_send_data;
    delete nap_recv_data;
}